

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QUrlModel::WatchItem>::emplace<QUrlModel::WatchItem>
          (QMovableArrayOps<QUrlModel::WatchItem> *this,qsizetype i,WatchItem *args)

{
  WatchItem **ppWVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  QAbstractItemModel *pQVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  WatchItem *pWVar10;
  WatchItem *pWVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  quintptr qVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
           super_QArrayDataPointer<QUrlModel::WatchItem>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0050183e:
    pQVar6 = (args->index).m.ptr;
    uVar14 = (args->index).r;
    uVar15 = (args->index).c;
    qVar16 = (args->index).i;
    pDVar7 = (args->path).d.d;
    pcVar8 = (args->path).d.ptr;
    (args->path).d.d = (Data *)0x0;
    qVar9 = (args->path).d.size;
    (args->path).d.ptr = (char16_t *)0x0;
    (args->path).d.size = 0;
    bVar17 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
             super_QArrayDataPointer<QUrlModel::WatchItem>.size != 0;
    QArrayDataPointer<QUrlModel::WatchItem>::detachAndGrow
              ((QArrayDataPointer<QUrlModel::WatchItem> *)this,(uint)(i == 0 && bVar17),1,
               (WatchItem **)0x0,(QArrayDataPointer<QUrlModel::WatchItem> *)0x0);
    pWVar10 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
              super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
    uStack_50 = (undefined4)qVar16;
    uStack_4c = (undefined4)(qVar16 >> 0x20);
    if (i != 0 || !bVar17) {
      pWVar11 = pWVar10 + i;
      memmove(pWVar11 + 1,pWVar10 + i,
              ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
               super_QArrayDataPointer<QUrlModel::WatchItem>.size - i) * 0x30);
      (pWVar11->index).r = uVar14;
      (pWVar11->index).c = uVar15;
      *(undefined4 *)&(pWVar11->index).i = uStack_50;
      *(undefined4 *)((long)&(pWVar11->index).i + 4) = uStack_4c;
      (pWVar11->index).m.ptr = pQVar6;
      (pWVar11->path).d.d = pDVar7;
      (pWVar11->path).d.ptr = pcVar8;
      (pWVar11->path).d.size = qVar9;
      goto LAB_0050190a;
    }
    pWVar10[-1].index.m.ptr = pQVar6;
    pWVar10[-1].index.r = uVar14;
    pWVar10[-1].index.c = uVar15;
    *(undefined4 *)&pWVar10[-1].index.i = uStack_50;
    *(undefined4 *)((long)&pWVar10[-1].index.i + 4) = uStack_4c;
    pWVar10[-1].path.d.d = pDVar7;
    pWVar10[-1].path.d.ptr = pcVar8;
    pWVar10[-1].path.d.size = qVar9;
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
            super_QArrayDataPointer<QUrlModel::WatchItem>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                      super_QArrayDataPointer<QUrlModel::WatchItem>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pWVar11 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
      pWVar11[lVar5].index.m.ptr = (args->index).m.ptr;
      iVar12 = (args->index).c;
      qVar16 = (args->index).i;
      uVar13 = *(undefined4 *)((long)&(args->index).i + 4);
      pWVar10 = pWVar11 + lVar5;
      (pWVar10->index).r = (args->index).r;
      (pWVar10->index).c = iVar12;
      *(int *)&(pWVar10->index).i = (int)qVar16;
      *(undefined4 *)((long)&(pWVar10->index).i + 4) = uVar13;
      pDVar7 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pWVar11[lVar5].path.d.d = pDVar7;
      pcVar8 = (args->path).d.ptr;
      (args->path).d.ptr = (char16_t *)0x0;
      pWVar11[lVar5].path.d.ptr = pcVar8;
      qVar9 = (args->path).d.size;
      (args->path).d.size = 0;
      pWVar11[lVar5].path.d.size = qVar9;
      goto LAB_0050190a;
    }
    if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
       ((WatchItem *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
        super_QArrayDataPointer<QUrlModel::WatchItem>.ptr)) goto LAB_0050183e;
    pWVar10 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
              super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
    pWVar10[-1].index.m.ptr = (args->index).m.ptr;
    iVar12 = (args->index).c;
    qVar16 = (args->index).i;
    uVar13 = *(undefined4 *)((long)&(args->index).i + 4);
    pWVar10[-1].index.r = (args->index).r;
    pWVar10[-1].index.c = iVar12;
    *(int *)&pWVar10[-1].index.i = (int)qVar16;
    *(undefined4 *)((long)&pWVar10[-1].index.i + 4) = uVar13;
    pDVar7 = (args->path).d.d;
    (args->path).d.d = (Data *)0x0;
    pWVar10[-1].path.d.d = pDVar7;
    pcVar8 = (args->path).d.ptr;
    (args->path).d.ptr = (char16_t *)0x0;
    pWVar10[-1].path.d.ptr = pcVar8;
    qVar9 = (args->path).d.size;
    (args->path).d.size = 0;
    pWVar10[-1].path.d.size = qVar9;
  }
  ppWVar1 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
             super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
  *ppWVar1 = *ppWVar1 + -1;
LAB_0050190a:
  pqVar2 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
            super_QArrayDataPointer<QUrlModel::WatchItem>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }